

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall Engine::solve(Engine *this,Problem *p,string *problemLabel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__addr;
  Clause *pCVar1;
  pointer pcVar2;
  int __len;
  RESULT RVar3;
  long lVar4;
  mapped_type *pmVar5;
  int __fd;
  char *pcVar6;
  uint i;
  ulong uVar7;
  Connector *pCVar8;
  random_device r;
  anon_union_5000_2_650ea050_for_random_device_0 local_13b8;
  
  this->problem = p;
  if (so.rnd_seed == 0) {
    std::random_device::random_device((random_device *)&local_13b8.field_0);
    so.rnd_seed = std::random_device::_M_getval();
    std::random_device::_M_fini();
  }
  (this->rnd)._M_x =
       (ulong)(long)so.rnd_seed % 0x7fffffff + (ulong)((ulong)(long)so.rnd_seed % 0x7fffffff == 0);
  init(this,(EVP_PKEY_CTX *)p);
  __fd = (int)p;
  lVar4 = std::chrono::_V2::steady_clock::now();
  (this->time_out).__d.__r = so.time_out.__r * 1000000 + lVar4;
  lVar4 = std::chrono::_V2::steady_clock::now();
  (this->init_time).__r = (lVar4 - (this->start_time).__d.__r) / 1000000;
  this->base_memory = 0.0;
  profilerConnector = (Connector *)operator_new(0xb8);
  __len = so.cpprofiler_port;
  (profilerConnector->marshalling).msg._have_label = false;
  (profilerConnector->marshalling).msg._label._M_dataplus._M_p =
       (pointer)&(profilerConnector->marshalling).msg._label.field_2;
  (profilerConnector->marshalling).msg._label._M_string_length = 0;
  (profilerConnector->marshalling).msg._label.field_2._M_local_buf[0] = '\0';
  (profilerConnector->marshalling).msg._have_nogood = false;
  (profilerConnector->marshalling).msg._nogood._M_dataplus._M_p =
       (pointer)&(profilerConnector->marshalling).msg._nogood.field_2;
  (profilerConnector->marshalling).msg._nogood._M_string_length = 0;
  (profilerConnector->marshalling).msg._nogood.field_2._M_local_buf[0] = '\0';
  (profilerConnector->marshalling).msg._have_info = false;
  __addr = &(profilerConnector->marshalling).msg._info.field_2;
  (profilerConnector->marshalling).msg._info._M_dataplus._M_p = (pointer)__addr;
  (profilerConnector->marshalling).msg._info._M_string_length = 0;
  (profilerConnector->marshalling).msg._info.field_2._M_local_buf[0] = '\0';
  (profilerConnector->marshalling).msg._have_version = false;
  profilerConnector->port = __len;
  profilerConnector->_connected = false;
  if (so.cpprofiler_enabled == true) {
    cpprofiler::Connector::connect(profilerConnector,__fd,(sockaddr *)__addr,__len);
  }
  if (so.learnt_stats == true) {
    std::ofstream::open(learntStatsStream,0x1da6fd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)learntStatsStream,"id,length,block",0xf);
    if (so.learnt_stats_nogood == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)learntStatsStream,",nogood",7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)learntStatsStream,",rawActivity\n",0xd);
  }
  RVar3 = search(this,problemLabel);
  this->status = RVar3;
  if (RVar3 - RES_LUN < 2) {
    if (this->solutions < 1) {
      pcVar6 = "=====UNSATISFIABLE=====\n";
      lVar4 = 0x18;
    }
    else {
      pcVar6 = "==========\n";
      lVar4 = 0xb;
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->output_stream,pcVar6,lVar4);
  }
  if ((so.learnt_stats == true) && (sat.learnts.sz != 0)) {
    uVar7 = 0;
    do {
      pCVar1 = sat.learnts.data[uVar7];
      local_13b8._0_4_ = pCVar1[1].data[*(uint *)pCVar1 >> 8].x;
      pmVar5 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&learntClauseString_abi_cxx11_,(key_type *)&local_13b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)learntStatsStream,(pmVar5->_M_dataplus)._M_p,pmVar5->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)learntStatsStream,",",1);
      std::ostream::operator<<
                ((ostream *)learntStatsStream,pCVar1[1].data[(ulong)(*(uint *)pCVar1 >> 8) - 1].x);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)learntStatsStream,"\n",1);
      uVar7 = uVar7 + 1;
    } while (uVar7 < sat.learnts.sz);
  }
  pCVar8 = profilerConnector;
  if ((so.print_nodes != false) || (profilerConnector->_connected == true)) {
    (profilerConnector->marshalling).msg._have_label = false;
    (pCVar8->marshalling).msg._have_nogood = false;
    (pCVar8->marshalling).msg._have_info = false;
    (pCVar8->marshalling).msg._have_version = false;
    (pCVar8->marshalling).msg._type = DONE;
    cpprofiler::Connector::sendOverSocket(pCVar8);
    if ((profilerConnector->_connected == true) &&
       (close(profilerConnector->sockfd), profilerConnector == (Connector *)0x0)) {
      pCVar8 = (Connector *)0x0;
      goto LAB_001b91ec;
    }
  }
  pCVar8 = profilerConnector;
  pcVar2 = (profilerConnector->marshalling).msg._info._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(profilerConnector->marshalling).msg._info.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (pCVar8->marshalling).msg._nogood._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(pCVar8->marshalling).msg._nogood.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (pCVar8->marshalling).msg._label._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(pCVar8->marshalling).msg._label.field_2) {
    operator_delete(pcVar2);
  }
LAB_001b91ec:
  operator_delete(pCVar8);
  if (0 < so.verbosity) {
    printStats(this);
  }
  return;
}

Assistant:

void Engine::solve(Problem* p, const std::string& problemLabel) {
	problem = p;

	// Setting the random seed
	if (so.rnd_seed == 0) {
		std::random_device r;
		so.rnd_seed = r();
	}
	rnd = std::default_random_engine(so.rnd_seed);

	init();

	time_out = chuffed_clock::now() + so.time_out;

	init_time = std::chrono::duration_cast<duration>(chuffed_clock::now() - start_time);
	base_memory = memUsed();

#ifdef HAS_PROFILER
	profilerConnector = new cpprofiler::Connector(so.cpprofiler_port);
	if (so.cpprofiler_enabled) {
		profilerConnector->connect();
	}
#endif

	/* if (so.debug) { */
	/*   for (int i = 0 ; i < 2*sat.nVars() ; i++) { */
	/*     std::cerr << "literal " << i << " is " << litString[i] << "\n"; */
	/*   } */
	/* } */

	if (so.learnt_stats) {
		learntStatsStream.open("learnt-stats.csv");
		learntStatsStream << "id,length,block";
		if (so.learnt_stats_nogood) {
			learntStatsStream << ",nogood";
		}
		learntStatsStream << ",rawActivity\n";
	}

	// sequential
	status = search(problemLabel);
	if (status == RES_GUN || status == RES_LUN) {
		if (solutions > 0) {
			(*output_stream) << "==========\n";
		} else {
			(*output_stream) << "=====UNSATISFIABLE=====\n";
		}
	}

	if (so.learnt_stats) {
		for (unsigned int i = 0; i < sat.learnts.size(); i++) {
			Clause& c = *(sat.learnts[i]);
			//        std::cerr << "clausescore," << c.clauseID() << ","
			//        << c.rawActivity() << "\n";
			const int id = c.clauseID();
			learntStatsStream << learntClauseString[id];
			learntStatsStream << ",";
			learntStatsStream << c.rawActivity();
			learntStatsStream << "\n";
		}
	}

#ifdef HAS_PROFILER
	if (doProfiling()) {
		profilerConnector->done();
		if (profilerConnector->connected()) {
			profilerConnector->disconnect();
		}
	}
	delete profilerConnector;
#endif

	if (so.verbosity >= 1) {
		printStats();
	}
}